

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp
# Opt level: O0

void __thiscall
DGRSubgraphMiningComputeAntecedentPatternFromPattern_two_isolated_nodes_Test::TestBody
          (DGRSubgraphMiningComputeAntecedentPatternFromPattern_two_isolated_nodes_Test *this)

{
  allocator<int> *paVar1;
  allocator<std::array<int,_10UL>_> *this_00;
  initializer_list<std::array<int,_10UL>_> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::array<int,_10UL>_> __l_03;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_6;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_5;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_4;
  Message local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_3;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_2;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> antecedent_pattern_node_labels_ADDED_ground_truth;
  undefined1 auStack_268 [8];
  vector<int,_std::allocator<int>_> antecedent_pattern_node_id_ADDED_ground_truth;
  array<int,_10UL> local_248;
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  antecedent_pattern_edges_ADDED_ground_truth;
  int local_1e8 [2];
  iterator local_1e0;
  size_type local_1d8;
  undefined1 local_1d0 [8];
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_id_ground_truth;
  int local_1b0 [2];
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_changetime_ground_truth;
  int local_178 [2];
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_labels_ground_truth;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  antecedent_pattern_edges_ground_truth;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> antecedent_pattern_node_labels_ADDED;
  vector<int,_std::allocator<int>_> antecedent_pattern_node_id_ADDED;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
  antecedent_pattern_edges_ADDED;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_id;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_changetime;
  vector<int,_std::allocator<int>_> antecedent_pattern_isolated_node_labels;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> antecedent_pattern_edges;
  allocator<std::array<int,_10UL>_> local_69;
  array<int,_10UL> local_68;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> pattern_edge_list;
  DGRSubgraphMiningComputeAntecedentPatternFromPattern_two_isolated_nodes_Test *this_local;
  
  local_68._M_elems[8] = -0xf;
  local_68._M_elems[9] = 0;
  local_68._M_elems[4] = 0;
  local_68._M_elems[5] = 0x65;
  local_68._M_elems[6] = 0;
  local_68._M_elems[7] = 0x1e;
  local_68._M_elems[0] = 0;
  local_68._M_elems[1] = 1;
  local_68._M_elems[2] = 0x14;
  local_68._M_elems[3] = -10;
  local_38 = &local_68;
  local_30 = 1;
  pattern_edge_list.
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::array<int,_10UL>_>::allocator(&local_69);
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_28,
             __l_03,&local_69);
  std::allocator<std::array<int,_10UL>_>::~allocator(&local_69);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_changetime.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_edges_ADDED.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_128);
  antecedent_pattern_isolated_node_labels_ground_truth.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_178[0] = 0x14;
  local_178[1] = 0x1e;
  local_170 = local_178;
  local_168 = 2;
  paVar1 = (allocator<int> *)
           ((long)&antecedent_pattern_isolated_node_changetime_ground_truth.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  __l_02._M_len = local_168;
  __l_02._M_array = local_170;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,__l_02,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&antecedent_pattern_isolated_node_changetime_ground_truth.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + 7));
  local_1b0[0] = -10;
  local_1b0[1] = 0xfffffff1;
  local_1a8 = local_1b0;
  local_1a0 = 2;
  paVar1 = (allocator<int> *)
           ((long)&antecedent_pattern_isolated_node_id_ground_truth.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  __l_01._M_len = local_1a0;
  __l_01._M_array = local_1a8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_198,__l_01,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&antecedent_pattern_isolated_node_id_ground_truth.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + 7));
  local_1e8[0] = 0;
  local_1e8[1] = 1;
  local_1e0 = local_1e8;
  local_1d8 = 2;
  paVar1 = (allocator<int> *)
           ((long)&antecedent_pattern_edges_ADDED_ground_truth.
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  __l_00._M_len = local_1d8;
  __l_00._M_array = local_1e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d0,__l_00,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&antecedent_pattern_edges_ADDED_ground_truth.
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_248._M_elems[8] = -0xf;
  local_248._M_elems[9] = 0;
  local_248._M_elems[4] = 0;
  local_248._M_elems[5] = 0x65;
  local_248._M_elems[6] = 0;
  local_248._M_elems[7] = 0x1e;
  local_248._M_elems[0] = 0;
  local_248._M_elems[1] = 1;
  local_248._M_elems[2] = 0x14;
  local_248._M_elems[3] = -10;
  local_218 = &local_248;
  local_210 = 1;
  this_00 = (allocator<std::array<int,_10UL>_> *)
            ((long)&antecedent_pattern_node_id_ADDED_ground_truth.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage + 7);
  std::allocator<std::array<int,_10UL>_>::allocator(this_00);
  __l._M_len = local_210;
  __l._M_array = local_218;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_208,__l
             ,this_00);
  std::allocator<std::array<int,_10UL>_>::~allocator
            ((allocator<std::array<int,_10UL>_> *)
             ((long)&antecedent_pattern_node_id_ADDED_ground_truth.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + 7));
  auStack_268 = (undefined1  [8])0x0;
  antecedent_pattern_node_id_ADDED_ground_truth.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  antecedent_pattern_node_id_ADDED_ground_truth.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_268);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
  dgrminer::compute_antecedent_pattern_from_pattern
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_28,
             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_changetime.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_edges_ADDED.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)local_128);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
            ((EqHelper<false> *)local_298,"antecedent_pattern_edges",
             "antecedent_pattern_edges_ground_truth",
             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar2) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message(&local_2a0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::
    Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              ((EqHelper<false> *)local_2c0,"antecedent_pattern_isolated_node_labels",
               "antecedent_pattern_isolated_node_labels_ground_truth",
               (vector<int,_std::allocator<int>_> *)
               &antecedent_pattern_isolated_node_changetime.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_160);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar2) {
      testing::Message::Message(&local_2c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                 ,0x5e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2c8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      testing::internal::EqHelper<false>::
      Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                ((EqHelper<false> *)local_2e0,"antecedent_pattern_isolated_node_changetime",
                 "antecedent_pattern_isolated_node_changetime_ground_truth",
                 (vector<int,_std::allocator<int>_> *)
                 &antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)local_198);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
      if (!bVar2) {
        testing::Message::Message(&local_2e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                   ,0x5f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_2e8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        testing::internal::EqHelper<false>::
        Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                  ((EqHelper<false> *)local_300,"antecedent_pattern_isolated_node_id",
                   "antecedent_pattern_isolated_node_id_ground_truth",
                   (vector<int,_std::allocator<int>_> *)
                   &antecedent_pattern_edges_ADDED.
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<int,_std::allocator<int>_> *)local_1d0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
        if (!bVar2) {
          testing::Message::Message(&local_308);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                     ,0x60,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_308);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_308);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          testing::internal::EqHelper<false>::
          Compare<std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>,std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>>
                    ((EqHelper<false> *)local_320,"antecedent_pattern_edges_ADDED",
                     "antecedent_pattern_edges_ADDED_ground_truth",
                     (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                     &antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                     local_208);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
          if (!bVar2) {
            testing::Message::Message(&local_328);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                       ,0x61,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_328);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_328);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            testing::internal::EqHelper<false>::
            Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                      ((EqHelper<false> *)local_340,"antecedent_pattern_node_id_ADDED",
                       "antecedent_pattern_node_id_ADDED_ground_truth",
                       (vector<int,_std::allocator<int>_> *)
                       &antecedent_pattern_node_labels_ADDED.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<int,_std::allocator<int>_> *)auStack_268);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
            if (!bVar2) {
              testing::Message::Message(&local_348);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                         ,0x62,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_348);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_348);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              testing::internal::EqHelper<false>::
              Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                        ((EqHelper<false> *)local_360,"antecedent_pattern_node_labels_ADDED",
                         "antecedent_pattern_node_labels_ADDED_ground_truth",
                         (vector<int,_std::allocator<int>_> *)local_128,
                         (vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
              if (!bVar2) {
                testing::Message::Message(&local_368);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
                testing::internal::AssertHelper::AssertHelper
                          (&local_370,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_dgrsubgraph_mining_compute_antecedent_pattern_from_pattern.cpp"
                           ,99,pcVar3);
                testing::internal::AssertHelper::operator=(&local_370,&local_368);
                testing::internal::AssertHelper::~AssertHelper(&local_370);
                testing::Message::~Message(&local_368);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                gtest_ar_1.message_.ptr_._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar.message_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_268);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_208);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_198);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_160);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels_ground_truth.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_node_labels_ADDED.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_node_id_ADDED.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_edges_ADDED.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_id.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &antecedent_pattern_isolated_node_changetime.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
             &antecedent_pattern_isolated_node_labels.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
            ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)local_28);
  return;
}

Assistant:

TEST(DGRSubgraphMiningComputeAntecedentPatternFromPattern, two_isolated_nodes)
{
    std::vector<std::array<int, PAT___SIZE>> pattern_edge_list = {
            {0, 1, 20, -10, 0, 101, 0, 30, -15, 0}
    };


    std::vector<std::array<int, 10>> antecedent_pattern_edges;
    std::vector<int> antecedent_pattern_isolated_node_labels;
    std::vector<int> antecedent_pattern_isolated_node_changetime;
    std::vector<int> antecedent_pattern_isolated_node_id;
    std::vector<std::array<int, 10>> antecedent_pattern_edges_ADDED;
    std::vector<int> antecedent_pattern_node_id_ADDED;
    std::vector<int> antecedent_pattern_node_labels_ADDED;

    std::vector<std::array<int, 10>> antecedent_pattern_edges_ground_truth = {};
    std::vector<int> antecedent_pattern_isolated_node_labels_ground_truth = {20, 30};
    std::vector<int> antecedent_pattern_isolated_node_changetime_ground_truth = {-10, -15};
    std::vector<int> antecedent_pattern_isolated_node_id_ground_truth = {0 ,1};
    std::vector<std::array<int, 10>> antecedent_pattern_edges_ADDED_ground_truth = {{0, 1, 20, -10, 0, 101, 0, 30, -15, 0}};
    std::vector<int> antecedent_pattern_node_id_ADDED_ground_truth = {};
    std::vector<int> antecedent_pattern_node_labels_ADDED_ground_truth = {};


    compute_antecedent_pattern_from_pattern(pattern_edge_list, antecedent_pattern_edges,
                                            antecedent_pattern_isolated_node_labels,
                                            antecedent_pattern_isolated_node_changetime,
                                            antecedent_pattern_isolated_node_id, antecedent_pattern_edges_ADDED,
                                            antecedent_pattern_node_id_ADDED,
                                            antecedent_pattern_node_labels_ADDED);

    ASSERT_EQ(antecedent_pattern_edges, antecedent_pattern_edges_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_labels, antecedent_pattern_isolated_node_labels_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_changetime, antecedent_pattern_isolated_node_changetime_ground_truth);
    ASSERT_EQ(antecedent_pattern_isolated_node_id, antecedent_pattern_isolated_node_id_ground_truth);
    ASSERT_EQ(antecedent_pattern_edges_ADDED, antecedent_pattern_edges_ADDED_ground_truth);
    ASSERT_EQ(antecedent_pattern_node_id_ADDED, antecedent_pattern_node_id_ADDED_ground_truth);
    ASSERT_EQ(antecedent_pattern_node_labels_ADDED, antecedent_pattern_node_labels_ADDED_ground_truth);
}